

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum4096_32.c
# Opt level: O0

void bn_slow_precomp(uint32_t len,uint64_t *n,uint64_t mu,uint64_t *r2,uint64_t *a,uint64_t *res)

{
  long lVar1;
  uint uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t *nInv;
  uint64_t uVar6;
  uint32_t uVar7;
  uint64_t *puVar8;
  uint64_t uStack_70;
  uint64_t uStack_68;
  uint64_t *local_60;
  uint64_t *local_58;
  ulong local_50;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  uint64_t *local_38;
  uint64_t *res_local;
  uint64_t *a_local;
  uint64_t *r2_local;
  uint64_t mu_local;
  uint64_t *n_local;
  uint32_t len_local;
  
  __vla_expr0 = (unsigned_long)&uStack_68;
  local_38 = res;
  res_local = a;
  a_local = r2;
  r2_local = (uint64_t *)mu;
  mu_local = (uint64_t)n;
  n_local._4_4_ = len;
  if (0x1fffffffffffffff < (ulong)len) {
    uStack_70 = 0x2ebc5b;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum64.c"
           ,0x89);
    uStack_70 = 0x2ebc65;
    exit(0xfd);
  }
  __vla_expr1 = (unsigned_long)len;
  lVar1 = -(__vla_expr1 * 8 + 0xf & 0xfffffffffffffff0);
  puVar8 = (uint64_t *)((long)&uStack_68 + lVar1);
  local_58 = puVar8;
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x2ebc9e;
  memset(puVar8,0,(ulong)len << 3);
  if (0x1fffffffffffffff < (ulong)(n_local._4_4_ * 2)) {
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x2ebccf;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum64.c"
           ,0x8c);
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x2ebcd9;
    exit(0xfd);
  }
  local_50 = (ulong)(n_local._4_4_ * 2);
  puVar8 = puVar8 + -local_50;
  uVar2 = n_local._4_4_ * 2;
  local_60 = puVar8;
  puVar8[-1] = 0x2ebd14;
  memset(puVar8,0,(ulong)uVar2 << 3);
  puVar4 = res_local;
  puVar3 = local_60;
  uVar2 = n_local._4_4_ * 2;
  puVar8[-1] = 0x2ebd2f;
  memcpy(puVar3,puVar4,(ulong)uVar2 << 3);
  uVar7 = n_local._4_4_;
  uVar6 = mu_local;
  puVar5 = r2_local;
  puVar4 = local_58;
  puVar3 = local_60;
  puVar8[-1] = 0x2ebd47;
  Hacl_Bignum_AlmostMontgomery_bn_almost_mont_reduction_u64
            (uVar7,(uint64_t *)uVar6,(uint64_t)puVar5,puVar3,puVar4);
  uVar7 = n_local._4_4_;
  uVar6 = mu_local;
  nInv = r2_local;
  puVar5 = a_local;
  puVar4 = local_38;
  puVar3 = local_58;
  puVar8[-1] = 0x2ebd63;
  Hacl_Bignum_Montgomery_bn_to_mont_u64(uVar7,(uint64_t *)uVar6,(uint64_t)nInv,puVar5,puVar3,puVar4)
  ;
  return;
}

Assistant:

static inline void
bn_slow_precomp(uint32_t *n, uint32_t mu, uint32_t *r2, uint32_t *a, uint32_t *res)
{
  uint32_t a_mod[128U] = { 0U };
  uint32_t a1[256U] = { 0U };
  memcpy(a1, a, 256U * sizeof (uint32_t));
  areduction(n, mu, a1, a_mod);
  to(n, mu, r2, a_mod, res);
}